

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocatorList.h
# Opt level: O3

void __thiscall
llvm::
AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
::~AllocatorList(AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                 *this)

{
  iterator I;
  
  for (I.NodePtr = (node_pointer)
                   (this->List).Sentinel.
                   super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                   .super_node_base_type.Next; (list_type *)I.NodePtr != &this->List;
      I = simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
          ::
          eraseAndDispose<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Disposer>
                    ((simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
                      *)&this->List,I,(Disposer)this)) {
  }
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
            (&this->super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>);
  return;
}

Assistant:

~AllocatorList() { clear(); }